

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

void __thiscall sentencepiece::SelfTestData::SelfTestData(SelfTestData *this,Arena *arena)

{
  (this->super_MessageLite)._internal_metadata_.ptr_ = arena;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SelfTestData_002127f0;
  google::protobuf::internal::ExtensionSet::ExtensionSet(&this->_extensions_,arena);
  (this->samples_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->samples_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->samples_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->samples_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  if (scc_info_SelfTestData_sentencepiece_5fmodel_2eproto.base.visit_status.super___atomic_base<int>
      ._M_i != 0) {
    google::protobuf::internal::InitSCCImpl
              (&scc_info_SelfTestData_sentencepiece_5fmodel_2eproto.base);
  }
  return;
}

Assistant:

SelfTestData::SelfTestData(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena),
  _extensions_(arena),
  samples_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:sentencepiece.SelfTestData)
}